

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpFloatAbs::TypeOpFloatAbs(TypeOpFloatAbs *this,TypeFactory *t,Translate *trans)

{
  OpBehavior *pOVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"ABS",&local_39);
  TypeOpFunc::TypeOpFunc(&this->super_TypeOpFunc,t,CPUI_FLOAT_ABS,&local_38,TYPE_FLOAT,TYPE_FLOAT);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f45f8;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48000;
  pOVar1 = (OpBehavior *)operator_new(0x18);
  pOVar1->opcode = CPUI_FLOAT_ABS;
  pOVar1->isunary = true;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fef08;
  pOVar1[1]._vptr_OpBehavior = (_func_int **)trans;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpFloatAbs::TypeOpFloatAbs(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_ABS,"ABS",TYPE_FLOAT,TYPE_FLOAT)
{
  opflags = PcodeOp::unary | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatAbs(trans);
}